

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O3

int __thiscall ncnn::ConvolutionDepthWise::destroy_pipeline(ConvolutionDepthWise *this,Option *opt)

{
  pointer pfVar1;
  pointer ppLVar2;
  pointer ppLVar3;
  long lVar4;
  Option opt_cpu;
  undefined8 local_48;
  Allocator *pAStack_40;
  Allocator *local_38;
  ulong uStack_30;
  undefined8 local_28;
  
  local_48._0_1_ = opt->lightmode;
  local_48._1_3_ = *(undefined3 *)&opt->field_0x1;
  local_48._4_4_ = opt->num_threads;
  pAStack_40 = opt->blob_allocator;
  local_38 = opt->workspace_allocator;
  uStack_30._0_1_ = opt->vulkan_compute;
  uStack_30._1_3_ = *(undefined3 *)&opt->field_0x19;
  uStack_30._4_4_ = opt->use_winograd_convolution;
  local_28._0_4_ = opt->use_sgemm_convolution;
  local_28._4_4_ = opt->use_int8_inference;
  uStack_30 = uStack_30 & 0xffffffffffffff00;
  ppLVar2 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar3 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar3 - (long)ppLVar2) >> 3)) {
    lVar4 = 0;
    do {
      (*ppLVar2[lVar4]->_vptr_Layer[5])(ppLVar2[lVar4],&local_48);
      ppLVar2 = (this->quantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppLVar2[lVar4] != (Layer *)0x0) {
        (*ppLVar2[lVar4]->_vptr_Layer[1])();
        ppLVar2 = (this->quantize_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      lVar4 = lVar4 + 1;
      ppLVar3 = (this->quantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (lVar4 < (int)((ulong)((long)ppLVar3 - (long)ppLVar2) >> 3));
  }
  if (ppLVar3 != ppLVar2) {
    (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar2;
  }
  ppLVar2 = (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar3 = (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar3 - (long)ppLVar2) >> 3)) {
    lVar4 = 0;
    do {
      (*ppLVar2[lVar4]->_vptr_Layer[5])(ppLVar2[lVar4],&local_48);
      ppLVar2 = (this->dequantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppLVar2[lVar4] != (Layer *)0x0) {
        (*ppLVar2[lVar4]->_vptr_Layer[1])();
        ppLVar2 = (this->dequantize_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      lVar4 = lVar4 + 1;
      ppLVar3 = (this->dequantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (lVar4 < (int)((ulong)((long)ppLVar3 - (long)ppLVar2) >> 3));
  }
  if (ppLVar3 != ppLVar2) {
    (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppLVar2;
  }
  ppLVar2 = (this->requantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar3 = (this->requantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar3 - (long)ppLVar2) >> 3)) {
    lVar4 = 0;
    do {
      (*ppLVar2[lVar4]->_vptr_Layer[5])(ppLVar2[lVar4],&local_48);
      ppLVar2 = (this->requantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppLVar2[lVar4] != (Layer *)0x0) {
        (*ppLVar2[lVar4]->_vptr_Layer[1])();
        ppLVar2 = (this->requantize_ops).
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      lVar4 = lVar4 + 1;
      ppLVar3 = (this->requantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (lVar4 < (int)((ulong)((long)ppLVar3 - (long)ppLVar2) >> 3));
  }
  if (ppLVar3 != ppLVar2) {
    (this->requantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppLVar2;
  }
  pfVar1 = (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (this->dequantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  pfVar1 = (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish != pfVar1) {
    (this->requantize_scales).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish = pfVar1;
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise::destroy_pipeline(const Option& opt)
{
    Option opt_cpu = opt;
    opt_cpu.vulkan_compute = false;

    for (int i=0; i<(int)quantize_ops.size(); i++)
    {
        quantize_ops[i]->destroy_pipeline(opt_cpu);
        delete quantize_ops[i];
    }
    quantize_ops.clear();

    for (int i=0; i<(int)dequantize_ops.size(); i++)
    {
        dequantize_ops[i]->destroy_pipeline(opt_cpu);
        delete dequantize_ops[i];
    }
    dequantize_ops.clear();

    for (int i=0; i<(int)requantize_ops.size(); i++)
    {
        requantize_ops[i]->destroy_pipeline(opt_cpu);
        delete requantize_ops[i];
    }
    requantize_ops.clear();

    dequantize_scales.clear();
    requantize_scales.clear();

    return 0;
}